

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void ARGB4444ToYRow_C(uint8_t *src_argb4444,uint8_t *dst_y,int width)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = 0;
  uVar3 = (ulong)(uint)width;
  if (width < 1) {
    uVar3 = uVar4;
  }
  for (; (int)uVar3 != (int)uVar4; uVar4 = uVar4 + 1) {
    bVar1 = src_argb4444[uVar4 * 2];
    iVar2 = libyuv::RGBToY(src_argb4444[uVar4 * 2 + 1] << 4 | src_argb4444[uVar4 * 2 + 1] & 0xf,
                           bVar1 & 0xf0 | bVar1 >> 4,bVar1 << 4 | bVar1 & 0xf);
    dst_y[uVar4] = (uint8_t)iVar2;
  }
  return;
}

Assistant:

void ARGB4444ToYRow_C(const uint8_t* src_argb4444, uint8_t* dst_y, int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint8_t b = src_argb4444[0] & 0x0f;
    uint8_t g = src_argb4444[0] >> 4;
    uint8_t r = src_argb4444[1] & 0x0f;
    b = (b << 4) | b;
    g = (g << 4) | g;
    r = (r << 4) | r;
    dst_y[0] = RGBToY(r, g, b);
    src_argb4444 += 2;
    dst_y += 1;
  }
}